

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glfwinfo.c
# Opt level: O1

void usage(void)

{
  puts(
      "Usage: glfwinfo [-h] [-a API] [-m MAJOR] [-n MINOR] [-d] [-l] [-f] [-p PROFILE] [-r STRATEGY]"
      );
  puts("Options:");
  puts("  -a the client API to use (gl or es)");
  puts("  -d request a debug context");
  puts("  -f require a forward-compatible context");
  puts("  -h show this help");
  puts("  -l list all client API extensions after context creation");
  puts("  -m the major number of the requred client API version");
  puts("  -n the minor number of the requred client API version");
  puts("  -p the OpenGL profile to use (core or compat)");
  puts("  -r the robustness strategy to use (none or lose)");
  return;
}

Assistant:

static void usage(void)
{
    printf("Usage: glfwinfo [-h] [-a API] [-m MAJOR] [-n MINOR] [-d] [-l] [-f] [-p PROFILE] [-r STRATEGY]\n");
    printf("Options:\n");
    printf("  -a the client API to use (" API_OPENGL " or " API_OPENGL_ES ")\n");
    printf("  -d request a debug context\n");
    printf("  -f require a forward-compatible context\n");
    printf("  -h show this help\n");
    printf("  -l list all client API extensions after context creation\n");
    printf("  -m the major number of the requred client API version\n");
    printf("  -n the minor number of the requred client API version\n");
    printf("  -p the OpenGL profile to use (" PROFILE_NAME_CORE " or " PROFILE_NAME_COMPAT ")\n");
    printf("  -r the robustness strategy to use (" STRATEGY_NAME_NONE " or " STRATEGY_NAME_LOSE ")\n");
}